

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O2

void __thiscall amrex::FabArrayBase::FB::define_epo(FB *this,FabArrayBase *fa)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *pmVar4;
  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_> *this_00
  ;
  undefined8 uVar5;
  undefined4 uVar6;
  BoxArray *this_01;
  pointer pBVar7;
  bool bVar8;
  IndexType IVar9;
  int iVar10;
  mapped_type *pmVar11;
  int *piVar12;
  _Rb_tree_node_base *p_Var13;
  int dir;
  uint uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  int ipass;
  int iVar21;
  pointer pBVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  pointer pIVar28;
  Box local_294;
  Box sbx;
  BoxList bl_remote;
  int src_owner;
  BoxArray *local_228;
  IntVect *local_220;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  BoxList bl_local;
  Box r_1;
  Box r;
  _Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_110;
  Box dbx;
  int dst_owner;
  undefined4 uStack_c4;
  pointer local_c0;
  Box r_6;
  Box result_1;
  Box r_3;
  Box local_4c;
  
  iVar21 = *(int *)(ParallelContext::frames + 0xc);
  piVar2 = (fa->indexArray).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  piVar3 = (fa->indexArray).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  IVar9 = BATransformer::index_type(&(fa->boxarray).m_bat);
  isects.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  isects.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  isects.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Periodicity::shiftIntVect
            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)&local_110,&this->m_period);
  uVar26 = (ulong)((long)piVar2 - (long)piVar3) >> 2;
  local_220 = &this->m_ngrow;
  pmVar4 = (this->super_CommMetaData).m_SndTags._M_t.
           super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
           .
           super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
           ._M_head_impl;
  Periodicity::Domain(&this->m_period);
  for (lVar16 = 0; uVar14 = (uint)lVar16, lVar16 != 3; lVar16 = lVar16 + 1) {
    uVar19 = 1 << ((byte)lVar16 & 0x1f);
    local_294.bigend.vect[lVar16] =
         (local_294.bigend.vect[lVar16] + (uint)((IVar9.itype >> (uVar14 & 0x1f) & 1) != 0)) -
         (uint)((local_294.btype.itype >> (uVar14 & 0x1f) & 1) != 0);
    if ((IVar9.itype >> (uVar14 & 0x1f) & 1) == 0) {
      local_294.btype.itype = ~uVar19 & local_294.btype.itype;
    }
    else {
      local_294.btype.itype = uVar19 | local_294.btype.itype;
    }
  }
  uVar27 = uVar26 & 0xffffffff;
  if ((int)uVar26 < 1) {
    uVar27 = 0;
  }
  local_228 = &fa->boxarray;
  for (uVar26 = 0; this_01 = local_228, uVar26 != uVar27; uVar26 = uVar26 + 1) {
    iVar1 = (fa->indexArray).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [uVar26];
    BoxArray::operator[](&r,local_228,iVar1);
    bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = r.bigend.vect[1];
    bl_remote._20_8_ = r._20_8_;
    bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)r.smallend.vect._0_8_;
    bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_4_ = r.smallend.vect[2];
    bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish._4_4_ = r.bigend.vect[0];
    Box::grow((Box *)&bl_remote,local_220);
    iVar15 = local_294.smallend.vect[0];
    if (local_294.smallend.vect[0] <
        (int)bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start) {
      iVar15 = (int)bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
    iVar10 = local_294.smallend.vect[1];
    if (local_294.smallend.vect[1] <
        bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start._4_4_) {
      iVar10 = bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_;
    }
    bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(iVar10,iVar15);
    iVar20 = local_294.smallend.vect[2];
    if (local_294.smallend.vect[2] <
        (int)bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_finish) {
      iVar20 = (int)bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish;
    }
    iVar25 = local_294.bigend.vect[0];
    if (bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish._4_4_ < local_294.bigend.vect[0]) {
      iVar25 = bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish._4_4_;
    }
    iVar23 = local_294.bigend.vect[1];
    if ((int)bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage < local_294.bigend.vect[1]) {
      iVar23 = (int)bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
    }
    iVar24 = local_294.bigend.vect[2];
    if (bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ < local_294.bigend.vect[2]) {
      iVar24 = bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_;
    }
    bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = iVar24;
    bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_4_ = iVar20;
    bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish._4_4_ = iVar25;
    bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = iVar23;
    if ((((iVar15 <= iVar25) && (iVar10 <= iVar23)) && (iVar20 <= iVar24)) &&
       (bl_remote.btype.itype < 8)) {
      for (pIVar28 = local_110._M_impl.super__Vector_impl_data._M_start;
          pIVar28 != local_110._M_impl.super__Vector_impl_data._M_finish; pIVar28 = pIVar28 + 1) {
        if (((pIVar28->vect[0] != 0) || (pIVar28->vect[1] != 0)) || (pIVar28->vect[2] != 0)) {
          r.bigend.vect[1] =
               (int)bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          r._20_8_ = bl_remote._20_8_;
          r.smallend.vect._0_8_ =
               bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start;
          r.smallend.vect[2] =
               (int)bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          r.bigend.vect[0] =
               bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish._4_4_;
          Box::operator+=(&r,pIVar28);
          BoxArray::intersections(local_228,&r,&isects,false,local_220);
          uVar17 = (ulong)((long)isects.
                                 super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)isects.
                                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5;
          uVar18 = uVar17 & 0xffffffff;
          if ((int)uVar17 < 1) {
            uVar18 = 0;
          }
          for (uVar17 = 0; uVar17 != uVar18; uVar17 = uVar17 + 1) {
            lVar16 = *(long *)&(((fa->distributionMap).m_ref.
                                 super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl;
            dst_owner = *(int *)(lVar16 + (long)isects.
                                                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[uVar17].
                                                first * 4);
            if (dst_owner < 0) {
              iVar15 = 0;
            }
            else {
              iVar15 = dst_owner - dst_owner % (int)ParallelDescriptor::m_Team._4_4_;
            }
            if ((ParallelDescriptor::m_Team._12_4_ != iVar15) &&
               (iVar21 == *(int *)(lVar16 + (long)iVar1 * 4))) {
              boxDiff(&bl_local,
                      &isects.
                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar17].second,&local_294);
              for (pBVar22 = bl_local.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data._M_start;
                  pBVar22 !=
                  bl_local.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish; pBVar22 = pBVar22 + 1) {
                pmVar11 = std::
                          map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                          ::operator[](pmVar4,&dst_owner);
                r_1.smallend.vect._0_8_ = *(undefined8 *)(pBVar22->smallend).vect;
                uVar5 = *(undefined8 *)((pBVar22->smallend).vect + 2);
                r_1._20_8_ = *(undefined8 *)((pBVar22->bigend).vect + 2);
                r_1.bigend.vect[1] = (int)((ulong)*(undefined8 *)(pBVar22->bigend).vect >> 0x20);
                r_1.smallend.vect[2] = (int)uVar5;
                r_1.bigend.vect[0] = (int)((ulong)uVar5 >> 0x20);
                Box::operator-=(&r_1,pIVar28);
                r.smallend.vect._0_8_ = *(undefined8 *)(pBVar22->smallend).vect;
                uVar5 = *(undefined8 *)(pBVar22->bigend).vect;
                r._20_8_ = *(undefined8 *)((pBVar22->bigend).vect + 2);
                r.smallend.vect[2] = (int)*(undefined8 *)((pBVar22->smallend).vect + 2);
                r.bigend.vect[0] = (int)uVar5;
                r.bigend.vect[1] = (int)((ulong)uVar5 >> 0x20);
                std::
                vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                ::emplace_back<amrex::FabArrayBase::CopyComTag>(pmVar11,(CopyComTag *)&r);
              }
              std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                        ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&bl_local);
            }
          }
        }
      }
    }
  }
  pmVar4 = (this->super_CommMetaData).m_RcvTags._M_t.
           super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
           .
           super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
           ._M_head_impl;
  IVar9 = BATransformer::index_type(&local_228->m_bat);
  BoxList::BoxList(&bl_local,IVar9);
  IVar9 = BATransformer::index_type(&this_01->m_bat);
  BoxList::BoxList(&bl_remote,IVar9);
  uVar6 = ParallelDescriptor::m_Team._4_4_;
  for (uVar26 = 0; uVar26 != uVar27; uVar26 = uVar26 + 1) {
    iVar1 = (fa->indexArray).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [uVar26];
    BoxArray::operator[](&local_4c,local_228,iVar1);
    result_1.bigend.vect[1] = local_4c.bigend.vect[1];
    result_1.bigend.vect[2] = local_4c.bigend.vect[2];
    result_1.btype.itype = local_4c.btype.itype;
    result_1.smallend.vect[0] = local_4c.smallend.vect[0];
    result_1.smallend.vect[1] = local_4c.smallend.vect[1];
    result_1.smallend.vect[2] = local_4c.smallend.vect[2];
    result_1.bigend.vect[0] = local_4c.bigend.vect[0];
    Box::grow(&result_1,local_220);
    bVar8 = Box::contains(&local_294,&result_1);
    if (!bVar8) {
      for (pIVar28 = local_110._M_impl.super__Vector_impl_data._M_start;
          pIVar28 != local_110._M_impl.super__Vector_impl_data._M_finish; pIVar28 = pIVar28 + 1) {
        if (((pIVar28->vect[0] != 0) || (pIVar28->vect[1] != 0)) || (pIVar28->vect[2] != 0)) {
          r.bigend.vect[1] = result_1.bigend.vect[1];
          r.bigend.vect[2] = result_1.bigend.vect[2];
          r.btype.itype = result_1.btype.itype;
          r.smallend.vect[0] = result_1.smallend.vect[0];
          r.smallend.vect[1] = result_1.smallend.vect[1];
          r.smallend.vect[2] = result_1.smallend.vect[2];
          r.bigend.vect[0] = result_1.bigend.vect[0];
          Box::operator+=(&r,pIVar28);
          BoxArray::intersections(local_228,&r,&isects,false,local_220);
          uVar17 = (ulong)((long)isects.
                                 super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)isects.
                                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5;
          uVar18 = uVar17 & 0xffffffff;
          if ((int)uVar17 < 1) {
            uVar18 = 0;
          }
          for (uVar17 = 0; uVar17 != uVar18; uVar17 = uVar17 + 1) {
            iVar15 = isects.
                     super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar17].first;
            r_3.smallend.vect._0_8_ =
                 *(undefined8 *)
                  isects.
                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar17].second.smallend.vect;
            uVar5 = *(undefined8 *)
                     (isects.
                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar17].second.smallend.vect + 2);
            r_3._20_8_ = *(undefined8 *)
                          (isects.
                           super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar17].second.bigend.vect + 2)
            ;
            r_3.bigend.vect[1] =
                 (int)((ulong)*(undefined8 *)
                               isects.
                               super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar17].second.bigend.vect
                      >> 0x20);
            r_3.smallend.vect[2] = (int)uVar5;
            r_3.bigend.vect[0] = (int)((ulong)uVar5 >> 0x20);
            Box::operator-=(&r_3,pIVar28);
            src_owner = *(int *)(*(long *)&(((fa->distributionMap).m_ref.
                                             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->m_pmap).
                                           super_vector<int,_std::allocator<int>_>.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                (long)iVar15 * 4);
            boxDiff((BoxList *)&r_1,&r_3,&local_294);
            for (piVar12 = (int *)r_1.smallend.vect._0_8_;
                piVar12 != (int *)CONCAT44(r_1.bigend.vect[0],r_1.smallend.vect[2]);
                piVar12 = piVar12 + 7) {
              sbx.smallend.vect._0_8_ = *(undefined8 *)piVar12;
              sbx.bigend.vect[2] = piVar12[5];
              sbx.btype.itype = piVar12[6];
              sbx.bigend.vect[1] = (int)((ulong)*(undefined8 *)(piVar12 + 3) >> 0x20);
              sbx.smallend.vect[2] = (int)*(undefined8 *)(piVar12 + 2);
              sbx.bigend.vect[0] = (int)((ulong)*(undefined8 *)(piVar12 + 2) >> 0x20);
              Box::operator+=(&sbx,pIVar28);
              iVar15 = local_294.smallend.vect[0];
              if (local_294.smallend.vect[0] < sbx.smallend.vect[0]) {
                iVar15 = sbx.smallend.vect[0];
              }
              iVar10 = local_294.smallend.vect[1];
              if (local_294.smallend.vect[1] < sbx.smallend.vect[1]) {
                iVar10 = sbx.smallend.vect[1];
              }
              sbx.smallend.vect[1] = iVar10;
              sbx.smallend.vect[0] = iVar15;
              iVar20 = local_294.smallend.vect[2];
              if (local_294.smallend.vect[2] < sbx.smallend.vect[2]) {
                iVar20 = sbx.smallend.vect[2];
              }
              iVar25 = local_294.bigend.vect[0];
              if (sbx.bigend.vect[0] < local_294.bigend.vect[0]) {
                iVar25 = sbx.bigend.vect[0];
              }
              iVar23 = local_294.bigend.vect[1];
              if (sbx.bigend.vect[1] < local_294.bigend.vect[1]) {
                iVar23 = sbx.bigend.vect[1];
              }
              iVar24 = local_294.bigend.vect[2];
              if (sbx.bigend.vect[2] < local_294.bigend.vect[2]) {
                iVar24 = sbx.bigend.vect[2];
              }
              sbx.bigend.vect[2] = iVar24;
              sbx.smallend.vect[2] = iVar20;
              sbx.bigend.vect[0] = iVar25;
              sbx.bigend.vect[1] = iVar23;
              if (((iVar15 <= iVar25) && (iVar10 <= iVar23)) &&
                 ((iVar20 <= iVar24 && (sbx.btype.itype < 8)))) {
                dbx.bigend.vect[2] = iVar24;
                dbx.btype.itype = sbx.btype.itype;
                dbx.smallend.vect[0] = iVar15;
                dbx.smallend.vect[1] = iVar10;
                dbx.smallend.vect[2] = iVar20;
                dbx.bigend.vect[0] = iVar25;
                dbx.bigend.vect[1] = iVar23;
                Box::operator-=(&dbx,pIVar28);
                if (src_owner < 0) {
                  iVar15 = 0;
                }
                else {
                  iVar15 = src_owner - src_owner % (int)ParallelDescriptor::m_Team._4_4_;
                }
                if (ParallelDescriptor::m_Team._12_4_ == iVar15) {
                  BoxList::BoxList((BoxList *)&dst_owner,&dbx,(IntVect *)&comm_tile_size);
                  pBVar7 = local_c0;
                  for (pBVar22 = (pointer)CONCAT44(uStack_c4,dst_owner); pBVar22 != pBVar7;
                      pBVar22 = pBVar22 + 1) {
                    this_00 = (this->super_CommMetaData).m_LocTags._M_t.
                              super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                              .
                              super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                              ._M_head_impl;
                    r_6.smallend.vect._0_8_ = *(undefined8 *)(pBVar22->smallend).vect;
                    uVar5 = *(undefined8 *)((pBVar22->smallend).vect + 2);
                    r_6._20_8_ = *(undefined8 *)((pBVar22->bigend).vect + 2);
                    r_6.bigend.vect[1] = (int)((ulong)*(undefined8 *)(pBVar22->bigend).vect >> 0x20)
                    ;
                    r_6.smallend.vect[2] = (int)uVar5;
                    r_6.bigend.vect[0] = (int)((ulong)uVar5 >> 0x20);
                    Box::operator+=(&r_6,pIVar28);
                    r.smallend.vect._0_8_ = *(undefined8 *)(pBVar22->smallend).vect;
                    uVar5 = *(undefined8 *)(pBVar22->bigend).vect;
                    r._20_8_ = *(undefined8 *)((pBVar22->bigend).vect + 2);
                    r.smallend.vect[2] = (int)*(undefined8 *)((pBVar22->smallend).vect + 2);
                    r.bigend.vect[0] = (int)uVar5;
                    r.bigend.vect[1] = (int)((ulong)uVar5 >> 0x20);
                    std::
                    vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                    ::emplace_back<amrex::FabArrayBase::CopyComTag>(this_00,(CopyComTag *)&r);
                  }
                  if (1 < (int)uVar6) {
                    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                              ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&bl_local,&dbx);
                  }
                  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&dst_owner);
                }
                else if (iVar21 == *(int *)(*(long *)&(((fa->distributionMap).m_ref.
                                                                                                                
                                                  super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->m_pmap).
                                                  super_vector<int,_std::allocator<int>_>.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + (long)iVar1 * 4)) {
                  pmVar11 = std::
                            map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                            ::operator[](pmVar4,&src_owner);
                  r.bigend.vect[1] = dbx.bigend.vect[1];
                  r.bigend.vect[2] = dbx.bigend.vect[2];
                  r.btype.itype = dbx.btype.itype;
                  r.smallend.vect[0] = dbx.smallend.vect[0];
                  r.smallend.vect[1] = dbx.smallend.vect[1];
                  r.smallend.vect[2] = dbx.smallend.vect[2];
                  r.bigend.vect[0] = dbx.bigend.vect[0];
                  std::
                  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                  ::emplace_back<amrex::FabArrayBase::CopyComTag>(pmVar11,(CopyComTag *)&r);
                }
              }
            }
            std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                      ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&r_1);
          }
        }
      }
      if ((long)bl_local.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)bl_local.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start < 0x38) {
        (this->super_CommMetaData).m_threadsafe_loc = true;
      }
      else {
        BoxArray::BoxArray((BoxArray *)&r,&bl_local);
        bVar8 = BoxArray::isDisjoint((BoxArray *)&r);
        (this->super_CommMetaData).m_threadsafe_loc = bVar8;
        BoxArray::~BoxArray((BoxArray *)&r);
      }
      if (CONCAT44(bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish._4_4_,
                   (int)bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_finish) -
          (long)bl_remote.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start < 0x38) {
        (this->super_CommMetaData).m_threadsafe_rcv = true;
      }
      else {
        BoxArray::BoxArray((BoxArray *)&r,&bl_remote);
        bVar8 = BoxArray::isDisjoint((BoxArray *)&r);
        (this->super_CommMetaData).m_threadsafe_rcv = bVar8;
        BoxArray::~BoxArray((BoxArray *)&r);
      }
    }
  }
  for (iVar21 = 0; iVar21 != 2; iVar21 = iVar21 + 1) {
    lVar16 = *(long *)((this->m_crse_ratio).vect + (ulong)(iVar21 != 0) * 2 + -5);
    for (p_Var13 = *(_Rb_tree_node_base **)(lVar16 + 0x18);
        p_Var13 != (_Rb_tree_node_base *)(lVar16 + 8);
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
      std::
      __sort<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (p_Var13[1]._M_parent,p_Var13[1]._M_left);
    }
  }
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&bl_remote);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&bl_local);
  std::_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~_Vector_base(&local_110);
  std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
  ~_Vector_base(&isects.
                 super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
               );
  return;
}

Assistant:

void
FabArrayBase::FB::define_epo (const FabArrayBase& fa)
{
    const int                  MyProc   = ParallelDescriptor::MyProc();
    const BoxArray&            ba       = fa.boxArray();
    const DistributionMapping& dm       = fa.DistributionMap();
    const Vector<int>&         imap     = fa.IndexArray();

    // For local copy, all workers in the same team will have the identical copy of tags
    // so that they can share work.  But for remote communication, they are all different.

    const int nlocal = imap.size();
    const IntVect& ng = m_ngrow;
    const IndexType& typ = ba.ixType();
    std::vector< std::pair<int,Box> > isects;

    const std::vector<IntVect>& pshifts = m_period.shiftIntVect();

    auto& send_tags = *m_SndTags;

    Box pdomain = m_period.Domain();
    pdomain.convert(typ);

    for (int i = 0; i < nlocal; ++i)
    {
        const int ksnd = imap[i];
        Box bxsnd = amrex::grow(ba[ksnd],ng);
        bxsnd &= pdomain; // source must be inside the periodic domain.

        if (!bxsnd.ok()) continue;

        for (auto pit=pshifts.cbegin(); pit!=pshifts.cend(); ++pit)
        {
            if (*pit != IntVect::TheZeroVector())
            {
                ba.intersections(bxsnd+(*pit), isects, false, ng);

                for (int j = 0, M = isects.size(); j < M; ++j)
                {
                    const int krcv      = isects[j].first;
                    const Box& bx       = isects[j].second;
                    const int dst_owner = dm[krcv];

                    if (ParallelDescriptor::sameTeam(dst_owner)) {
                        continue;  // local copy will be dealt with later
                    } else if (MyProc == dm[ksnd]) {
                        const BoxList& bl = amrex::boxDiff(bx, pdomain);
                        for (BoxList::const_iterator lit = bl.begin(); lit != bl.end(); ++lit) {
                            send_tags[dst_owner].push_back(CopyComTag(*lit, (*lit)-(*pit), krcv, ksnd));
                        }
                    }
                }
            }
        }
    }

    auto& recv_tags = *m_RcvTags;

    BoxList bl_local(ba.ixType());
    BoxList bl_remote(ba.ixType());

    bool check_local = false, check_remote = false;
#if defined(AMREX_USE_GPU)
    check_local = true;
    check_remote = true;
#elif defined(AMREX_USE_OMP)
    if (omp_get_max_threads() > 1) {
        check_local = true;
        check_remote = true;
    }
#endif

    if (ParallelDescriptor::TeamSize() > 1) {
        check_local = true;
    }

    for (int i = 0; i < nlocal; ++i)
    {
        const int   krcv = imap[i];
        const Box& vbx   = ba[krcv];
        const Box& bxrcv = amrex::grow(vbx, ng);

        if (pdomain.contains(bxrcv)) continue;

        for (std::vector<IntVect>::const_iterator pit=pshifts.begin(); pit!=pshifts.end(); ++pit)
        {
            if (*pit != IntVect::TheZeroVector())
            {
                ba.intersections(bxrcv+(*pit), isects, false, ng);

                for (int j = 0, M = isects.size(); j < M; ++j)
                {
                    const int ksnd      = isects[j].first;
                    const Box& dst_bx   = isects[j].second - *pit;
                    const int src_owner = dm[ksnd];

                    const BoxList& bl = amrex::boxDiff(dst_bx, pdomain);

                    for (BoxList::const_iterator lit = bl.begin(); lit != bl.end(); ++lit)
                    {
                        Box sbx = (*lit) + (*pit);
                        sbx &= pdomain; // source must be inside the periodic domain.

                        if (sbx.ok()) {
                            Box dbx = sbx - (*pit);
                            if (ParallelDescriptor::sameTeam(src_owner)) { // local copy
                                const BoxList tilelist(dbx, FabArrayBase::comm_tile_size);
                                for (BoxList::const_iterator
                                         it_tile  = tilelist.begin(),
                                         End_tile = tilelist.end();   it_tile != End_tile; ++it_tile)
                                {
                                    m_LocTags->push_back(CopyComTag(*it_tile, (*it_tile)+(*pit), krcv, ksnd));
                                }
                                if (check_local) {
                                    bl_local.push_back(dbx);
                                }
                            } else if (MyProc == dm[krcv]) {
                                recv_tags[src_owner].push_back(CopyComTag(dbx, sbx, krcv, ksnd));
                                if (check_remote) {
                                    bl_remote.push_back(dbx);
                                }
                            }
                        }
                    }
                }
            }
        }

        if (bl_local.size() <= 1) {
            m_threadsafe_loc = true;
        } else {
            m_threadsafe_loc = BoxArray(std::move(bl_local)).isDisjoint();
        }

        if (bl_remote.size() <= 1) {
            m_threadsafe_rcv = true;
        } else {
            m_threadsafe_rcv = BoxArray(std::move(bl_remote)).isDisjoint();
        }
    }

    for (int ipass = 0; ipass < 2; ++ipass) // pass 0: send; pass 1: recv
    {
        CopyComTag::MapOfCopyComTagContainers & Tags = (ipass == 0) ? *m_SndTags : *m_RcvTags;
        for (auto& kv : Tags)
        {
            std::vector<CopyComTag>& cctv = kv.second;
            // We need to fix the order so that the send and recv processes match.
            std::sort(cctv.begin(), cctv.end());
        }
    }
}